

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTestPackage.cpp
# Opt level: O2

void __thiscall es31cts::TestCaseWrapper::deinit(TestCaseWrapper *this,TestCase *testCase)

{
  PackageContext *pPVar1;
  
  (*(testCase->super_TestNode)._vptr_TestNode[3])(testCase);
  pPVar1 = (this->m_testPackage->super_TestPackage).m_packageCtx;
  glu::resetState((pPVar1->m_context).m_renderCtx,(pPVar1->m_context).m_contextInfo);
  return;
}

Assistant:

void TestCaseWrapper::deinit(tcu::TestCase* testCase)
{
	testCase->deinit();

	glu::resetState(m_testPackage.getContext().getRenderContext(), m_testPackage.getContext().getContextInfo());
}